

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

int64 __thiscall TTD::EventLog::GetKthEventTimeInLog(EventLog *this,uint32 k)

{
  int64 iVar1;
  uint32 uVar2;
  bool bVar3;
  undefined1 local_48 [8];
  Iterator iter;
  
  TTEventList::GetIteratorAtFirst((Iterator *)local_48,&this->m_eventList);
  bVar3 = local_48 == (undefined1  [8])0x0;
  if (!bVar3) {
    uVar2 = 0;
    do {
      if (iter.m_currLink < *(TTEventListLink **)((long)local_48 + 8)) {
        return -1;
      }
      if ((TTEventListLink *)*(size_t *)local_48 <= iter.m_currLink) {
        return -1;
      }
      if (((bVar3) || (iter.m_currLink < *(TTEventListLink **)((long)local_48 + 8))) ||
         ((TTEventListLink *)*(size_t *)local_48 <= iter.m_currLink)) {
LAB_008e310e:
        TTDAbort_unrecoverable_error("Iterator is invalid!!!");
      }
      bVar3 = NSLogEvents::IsJsRTActionRootCall
                        ((EventLogEntry *)
                         (*(byte **)((long)local_48 + 0x10) + (long)&(iter.m_currLink)->CurrPos));
      if ((bVar3) && (uVar2 = uVar2 + 1, uVar2 == k)) {
        if ((local_48 != (undefined1  [8])0x0) &&
           ((*(TTEventListLink **)((long)local_48 + 8) <= iter.m_currLink &&
            (iter.m_currLink < (TTEventListLink *)*(size_t *)local_48)))) {
          iVar1 = NSLogEvents::GetTimeFromRootCallOrSnapshot
                            ((EventLogEntry *)
                             (*(byte **)((long)local_48 + 0x10) + (long)&(iter.m_currLink)->CurrPos)
                            );
          return iVar1;
        }
        goto LAB_008e310e;
      }
      TTEventList::Iterator::MoveNext((Iterator *)local_48);
      bVar3 = local_48 == (undefined1  [8])0x0;
    } while (!bVar3);
  }
  return -1;
}

Assistant:

int64 EventLog::GetKthEventTimeInLog(uint32 k) const
    {
        uint32 topLevelCount = 0;
        for(auto iter = this->m_eventList.GetIteratorAtFirst(); iter.IsValid(); iter.MoveNext())
        {
            if(NSLogEvents::IsJsRTActionRootCall(iter.Current()))
            {
                topLevelCount++;

                if(topLevelCount == k)
                {
                    return NSLogEvents::GetTimeFromRootCallOrSnapshot(iter.Current());
                }
            }
        }

        return -1;
    }